

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sexp_conflict
sexp_open_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
              sexp_conflict arg1,sexp_conflict arg2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  int *in_R9;
  sexp_conflict res;
  long local_78;
  long local_70;
  int local_60;
  int local_58;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 9)) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if ((((ulong)in_R9 & 1) == 1) || ((((ulong)in_R9 & 3) == 0 && (*in_R9 == 0xc)))) {
        if (((ulong)in_R8 & 1) == 1) {
          auVar1._8_8_ = (long)in_R8 >> 0x3f;
          auVar1._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
          local_58 = SUB164(auVar1 / SEXT816(2),0);
        }
        else {
          if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
            local_60 = (int)(char)in_R8[2] * (int)*(undefined8 *)(in_R8 + 6);
          }
          else {
            local_60 = 0;
          }
          local_58 = local_60;
        }
        if (((ulong)in_R9 & 1) == 1) {
          auVar2._8_8_ = (long)in_R9 >> 0x3f;
          auVar2._0_8_ = (ulong)in_R9 & 0xfffffffffffffffe;
          local_70 = SUB168(auVar2 / SEXT816(2),0);
        }
        else {
          if ((((ulong)in_R9 & 3) == 0) && (*in_R9 == 0xc)) {
            local_78 = (long)(char)in_R9[2] * *(long *)(in_R9 + 6);
          }
          else {
            local_78 = 0;
          }
          local_70 = local_78;
        }
        iVar3 = open((char *)(*(long *)(in_RCX + 2) + 0x10 + *(long *)(in_RCX + 4)),local_58,
                     local_70);
        local_8 = (sexp_conflict)sexp_make_fileno_op(in_RDI,0,2,(long)iVar3 << 1 | 1,0x3e);
      }
      else {
        local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R9);
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,9,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_open_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2) {
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  res = sexp_make_fileno(ctx, sexp_make_fixnum(open(sexp_string_data(arg0), sexp_sint_value(arg1), sexp_sint_value(arg2))), SEXP_FALSE);
  return res;
}